

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

pid_t proc_spawn(char **args)

{
  uint uVar1;
  char *pcVar2;
  int local_1c;
  int local_18;
  int32_t i_1;
  int i;
  pid_t pid;
  char **args_local;
  
  uVar1 = fork();
  if (uVar1 == 0) {
    close(0);
    for (local_18 = 3; local_18 < 0x100; local_18 = local_18 + 1) {
      close(local_18);
    }
    execvp(*args,args);
    perror("Failed");
    exit(1);
  }
  printf("Spawning process [PID=%d]:",(ulong)uVar1);
  for (local_1c = 0; args[local_1c] != (char *)0x0; local_1c = local_1c + 1) {
    pcVar2 = strchr(args[local_1c],0x20);
    if (pcVar2 == (char *)0x0) {
      printf(" %s",args[local_1c]);
    }
    else {
      printf(" \'%s\'",args[local_1c]);
    }
  }
  printf("\n");
  return uVar1;
}

Assistant:

pid_t proc_spawn(char *const args[]) {
    pid_t pid = 0;
    if ((pid = fork()) == 0) {

#if !SHARE_STDIN
        close(STDIN_FILENO);
#endif
#if !SHARE_STDOUT
        close(STDOUT_FILENO);
#endif
#if !SHARE_STDERR
        close(STDERR_FILENO);
#endif

        //
        // Close opened filedescriptors from parent
        //
        for (int i = STDERR_FILENO + 1; i < 256; i++)
            close(i);

#if !SHARE_PROCESS_GROUP
        setsid();
#endif

        execvp(args[0], args);
        perror("Failed");
        exit(EXIT_FAILURE);
    }

    printf("Spawning process [PID=%d]:", pid);
    for (int32_t i = 0; args[i] != NULL; i++) {
        if (strchr(args[i], ' ')) {
            printf(" '%s'", args[i]);
        } else {
            printf(" %s", args[i]);
        }
    }
    printf("\n");
    return pid;
}